

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmap.c
# Opt level: O2

void mkmap(level *lev,lev_init *init_lev)

{
  mkroom *__s;
  char cVar1;
  char btyp;
  char cVar2;
  char cVar3;
  byte bVar4;
  boolean bVar5;
  uint uVar6;
  undefined1 *puVar7;
  mkroom *pmVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  char *pcVar12;
  ulong uVar13;
  int i;
  int iVar14;
  long lVar15;
  schar *psVar16;
  long lVar17;
  char cVar18;
  mkroom *croom;
  uint uVar19;
  char *pcVar20;
  char cVar21;
  long lVar22;
  level *plVar23;
  short sVar24;
  undefined1 *puVar25;
  uint uVar26;
  schar sVar27;
  mkroom *croom_00;
  char cVar28;
  coord local_74;
  coord sm;
  long local_50;
  
  cVar1 = init_lev->fg;
  btyp = init_lev->bg;
  cVar18 = init_lev->smoothed;
  cVar2 = init_lev->joined;
  cVar28 = init_lev->lit;
  cVar3 = init_lev->walled;
  if (cVar28 < '\0') {
    bVar4 = depth(&u.uz);
    uVar6 = rnd((uint)(byte)(((bVar4 ^ (char)bVar4 >> 7) - ((char)bVar4 >> 7)) + 1));
    if (uVar6 < 0xb) {
      uVar6 = mt_random();
      cVar28 = uVar6 % 0x4d != 0;
    }
    else {
      cVar28 = '\0';
    }
  }
  new_locations = (char *)malloc(0x62c);
  if (btyp < '\'') {
    puVar7 = &lev->locations[1][0].field_0x6;
    for (lVar11 = 1; lVar11 != 0x50; lVar11 = lVar11 + 1) {
      for (lVar15 = 0; lVar15 != 0xfc; lVar15 = lVar15 + 0xc) {
        puVar7[lVar15 + -2] = btyp;
        puVar7[lVar15 + 1] = puVar7[lVar15 + 1] & 0xfb;
      }
      puVar7 = puVar7 + 0xfc;
    }
  }
  if (cVar1 < '\'') {
    uVar13 = 0;
    while (uVar13 < 0x270) {
      uVar6 = mt_random();
      uVar26 = uVar6 % 0x4d + 2;
      uVar6 = rnd(0x13);
      if (lev->locations[uVar26][uVar6].typ == btyp) {
        lev->locations[uVar26][uVar6].typ = cVar1;
        uVar13 = uVar13 + 1;
      }
    }
  }
  for (lVar11 = 2; lVar15 = 1, lVar11 != 0x4f; lVar11 = lVar11 + 1) {
    for (; lVar15 != 0x14; lVar15 = lVar15 + 1) {
      uVar6 = 0;
      for (lVar22 = 0; lVar22 != 8; lVar22 = lVar22 + 1) {
        sVar27 = btyp;
        if ((0xffffffb1 < (dirs[lVar22 * 2] + (int)lVar11) - 0x4fU) &&
           (uVar26 = dirs[lVar22 * 2 + 1] + (int)lVar15, uVar26 < 0x14)) {
          sVar27 = lev->locations[(uint)(dirs[lVar22 * 2] + (int)lVar11)][uVar26].typ;
        }
        uVar6 = uVar6 + (sVar27 == cVar1);
      }
      cVar21 = cVar1;
      if ((((uVar6 & 0xffff) - 5 < 4) || (cVar21 = btyp, (uVar6 & 0xffff) < 3)) && (cVar21 < '\''))
      {
        lev->locations[lVar11][lVar15].typ = cVar21;
      }
    }
  }
  for (lVar11 = 2; lVar15 = 1, lVar11 != 0x4f; lVar11 = lVar11 + 1) {
    for (; lVar15 != 0x14; lVar15 = lVar15 + 1) {
      sVar24 = 0;
      for (lVar22 = 0; lVar22 != 8; lVar22 = lVar22 + 1) {
        sVar27 = btyp;
        if ((0xffffffb1 < (dirs[lVar22 * 2] + (int)lVar11) - 0x4fU) &&
           (uVar6 = dirs[lVar22 * 2 + 1] + (int)lVar15, uVar6 < 0x14)) {
          sVar27 = lev->locations[(uint)(dirs[lVar22 * 2] + (int)lVar11)][uVar6].typ;
        }
        sVar24 = sVar24 + (ushort)(sVar27 == cVar1);
      }
      cVar21 = btyp;
      if (sVar24 != 5) {
        cVar21 = lev->locations[lVar11][lVar15].typ;
      }
      new_locations[lVar11 + lVar15 * 0x4f] = cVar21;
    }
  }
  psVar16 = &lev->locations[2][1].typ;
  pcVar12 = new_locations + 0x51;
  for (lVar11 = 2; lVar11 != 0x4f; lVar11 = lVar11 + 1) {
    pcVar20 = pcVar12;
    for (lVar15 = 0; lVar15 != 0xe4; lVar15 = lVar15 + 0xc) {
      if (*pcVar20 < '\'') {
        psVar16[lVar15] = *pcVar20;
      }
      pcVar20 = pcVar20 + 0x4f;
    }
    psVar16 = psVar16 + 0xfc;
    pcVar12 = pcVar12 + 1;
  }
  if (cVar18 != '\0') {
    for (iVar14 = 0; lVar11 = 2, iVar14 != 2; iVar14 = iVar14 + 1) {
      for (; lVar15 = 1, lVar11 != 0x4f; lVar11 = lVar11 + 1) {
        for (; lVar15 != 0x14; lVar15 = lVar15 + 1) {
          sVar24 = 0;
          for (lVar22 = 0; lVar22 != 8; lVar22 = lVar22 + 1) {
            cVar18 = btyp;
            if ((0xffffffb1 < (dirs[lVar22 * 2] + (int)lVar11) - 0x4fU) &&
               (uVar6 = dirs[lVar22 * 2 + 1] + (int)lVar15, uVar6 < 0x14)) {
              cVar18 = lev->locations[(uint)(dirs[lVar22 * 2] + (int)lVar11)][uVar6].typ;
            }
            sVar24 = sVar24 + (ushort)(cVar18 == cVar1);
          }
          cVar18 = btyp;
          if (2 < sVar24) {
            cVar18 = lev->locations[lVar11][lVar15].typ;
          }
          new_locations[lVar11 + lVar15 * 0x4f] = cVar18;
        }
      }
      pcVar12 = new_locations + 0x51;
      psVar16 = &lev->locations[2][1].typ;
      for (lVar11 = 2; lVar11 != 0x4f; lVar11 = lVar11 + 1) {
        pcVar20 = pcVar12;
        for (lVar15 = 0; lVar15 != 0xe4; lVar15 = lVar15 + 0xc) {
          if (*pcVar20 < '\'') {
            psVar16[lVar15] = *pcVar20;
          }
          pcVar20 = pcVar20 + 0x4f;
        }
        psVar16 = psVar16 + 0xfc;
        pcVar12 = pcVar12 + 1;
      }
    }
  }
  if (cVar2 != '\0') {
    __s = lev->rooms;
    for (local_50 = 2; local_50 != 0x4f; local_50 = local_50 + 1) {
      for (lVar11 = 1; lVar11 != 0x14; lVar11 = lVar11 + 1) {
        if ((lev->locations[local_50][lVar11].typ == cVar1) &&
           ((lev->locations[local_50][lVar11].field_0x8 & 0x3f) == 0)) {
          min_rx = (int)local_50;
          n_loc_filled = 0;
          min_ry = (int)lVar11;
          max_rx = min_rx;
          max_ry = min_ry;
          flood_fill_rm(lev,min_rx,min_ry,lev->nroom + 3,'\0','\0');
          lVar15 = (long)min_rx;
          if (n_loc_filled < 4) {
            puVar7 = &lev->locations[lVar15][0].field_0x6;
            for (; lVar15 <= max_rx; lVar15 = lVar15 + 1) {
              lVar22 = (long)min_ry;
              lVar17 = lVar22 * 0xc;
              puVar25 = puVar7;
              iVar14 = max_ry;
              for (; lVar22 <= iVar14; lVar22 = lVar22 + 1) {
                if ((*(uint *)(puVar25 + lVar17) >> 0x10 & 0x3f) == lev->nroom + 3U) {
                  puVar25[lVar17 + -2] = btyp;
                  *(uint *)(puVar25 + lVar17) = *(uint *)(puVar25 + lVar17) & 0xffc0ffff;
                  iVar14 = max_ry;
                }
                puVar25 = puVar25 + 0xc;
              }
              puVar7 = puVar7 + 0xfc;
            }
          }
          else {
            add_room(lev,min_rx,min_ry,max_rx,max_ry,'\0','\0','\x01');
            iVar14 = lev->nroom;
            __s[(long)iVar14 + -1].irregular = '\x01';
            if (0x4f < (long)iVar14) goto LAB_001d1d00;
          }
        }
      }
    }
LAB_001d1d00:
    croom_00 = lev->rooms;
    croom = __s;
    while( true ) {
      croom_00 = croom_00 + 1;
      uVar13 = (ulong)lev->nroom;
      pmVar8 = __s;
      if (__s + uVar13 <= croom_00) break;
      bVar5 = somexy(lev,croom,&sm);
      if ((bVar5 == '\0') || (bVar5 = somexy(lev,croom_00,&local_74), bVar5 == '\0')) {
        impossible("No start/end room loc in join_map.");
        sm.x = (char)((int)(short)((short)croom->hx - (short)croom->lx) / 2) + croom->lx;
        sm.y = (char)((int)(short)((short)croom->hy - (short)croom->ly) / 2) + croom->ly;
        local_74.x = (char)((int)(short)((short)croom_00->hx - (short)croom_00->lx) / 2) +
                     croom_00->lx;
        local_74.y = (char)((int)(short)((short)croom_00->hy - (short)croom_00->ly) / 2) +
                     croom_00->ly;
      }
      dig_corridor(lev,&sm,&local_74,'\0',cVar1,btyp);
      if ((croom->hx < croom_00->lx) ||
         (((croom->hy < croom_00->ly || (croom_00->hy < croom->ly)) &&
          (uVar6 = mt_random(), uVar6 % 3 != 0)))) {
        croom = croom_00;
      }
    }
    for (; pmVar8 < __s + (int)uVar13; pmVar8 = pmVar8 + 1) {
      lVar11 = (long)pmVar8->lx;
      puVar7 = &lev->locations[lVar11][0].field_0x6;
      for (; lVar11 <= pmVar8->hx; lVar11 = lVar11 + 1) {
        lVar15 = (long)pmVar8->ly;
        puVar25 = puVar7 + lVar15 * 0xc;
        for (; lVar15 <= pmVar8->hy; lVar15 = lVar15 + 1) {
          puVar25[2] = puVar25[2] & 0xc0;
          puVar25 = puVar25 + 0xc;
        }
        puVar7 = puVar7 + 0xfc;
      }
      uVar13 = (ulong)(uint)lev->nroom;
    }
    memset(__s,0,0x4530);
    lev->rooms[0].hx = -1;
    lev->subrooms->hx = -1;
    lev->nroom = 0;
  }
  if (cVar3 != '\0') {
    lVar11 = 1;
    uVar6 = 0xffffffff;
    plVar23 = lev;
    for (lVar15 = 0; lVar15 != 0x4f; lVar15 = lVar15 + 1) {
      uVar26 = 2;
      for (uVar13 = 0; uVar13 != 0x15; uVar13 = uVar13 + 1) {
        if (lev->locations[lVar11][uVar13].typ == '\0') {
          for (uVar19 = (int)uVar13 - 1; uVar19 != uVar26; uVar19 = uVar19 + 1) {
            uVar10 = uVar6;
            for (lVar22 = 0x44; lVar22 != 0x338; lVar22 = lVar22 + 0xfc) {
              if (((uVar19 < 0x15) && (uVar10 < 0x4f)) &&
                 (plVar23->levname[lVar22 + (ulong)uVar19 * 0xc] == '\x19')) {
                lev->locations[lVar11][uVar13].typ = '\x02' - (uVar13 == uVar19);
              }
              uVar10 = uVar10 + 1;
            }
          }
        }
        uVar26 = uVar26 + 1;
      }
      lVar11 = lVar11 + 1;
      plVar23 = (level *)&plVar23->locations[0][0xf].field_0x8;
      uVar6 = uVar6 + 1;
    }
  }
  if (cVar28 != '\0') {
    psVar16 = &lev->locations[1][0].typ;
    for (lVar11 = 1; lVar11 != 0x50; lVar11 = lVar11 + 1) {
      for (lVar15 = 0; lVar15 != 0xfc; lVar15 = lVar15 + 0xc) {
        if ((cVar1 < '\x11') || (psVar16[lVar15] != cVar1)) {
          if ('\x10' < btyp) {
            if (psVar16[lVar15] != btyp) goto LAB_001d1fef;
            goto LAB_001d200c;
          }
          if ((btyp == '\r') && (psVar16[lVar15] == '\r')) goto LAB_001d200c;
LAB_001d1fef:
          if ((cVar3 != '\0') && (psVar16[lVar15] < '\r' && psVar16[lVar15] != '\0'))
          goto LAB_001d200c;
        }
        else {
LAB_001d200c:
          psVar16[lVar15 + 3] = psVar16[lVar15 + 3] | 4;
        }
      }
      psVar16 = psVar16 + 0xfc;
    }
    uVar9 = 0;
    uVar13 = (ulong)(uint)lev->nroom;
    if (lev->nroom < 1) {
      uVar13 = uVar9;
    }
    for (; uVar13 * 0xd8 - uVar9 != 0; uVar9 = uVar9 + 0xd8) {
      *(undefined1 *)((long)lev->rooms[0].sbrooms + (uVar9 - 0xb)) = 1;
    }
  }
  puVar7 = &lev->locations[1][0].field_0x6;
  for (lVar11 = 1; lVar11 != 0x50; lVar11 = lVar11 + 1) {
    for (lVar15 = 0; lVar15 != 0xfc; lVar15 = lVar15 + 0xc) {
      if (puVar7[lVar15 + -2] == '\x15') {
        puVar7[lVar15 + 1] = puVar7[lVar15 + 1] | 4;
      }
    }
    puVar7 = puVar7 + 0xfc;
  }
  if ((cVar2 != '\0' && cVar3 != '\0') && (-1 < init_lev->filling)) {
    *(uint *)&(lev->flags).field_0x8 = *(uint *)&(lev->flags).field_0x8 & 0xfff5ffff | 0x80000;
    cVar1 = init_lev->filling;
    if (cVar1 < '\'') {
      puVar7 = &lev->locations[1][0].field_0x6;
      for (lVar11 = 1; lVar11 != 0x50; lVar11 = lVar11 + 1) {
        for (lVar15 = 0; lVar15 != 0xfc; lVar15 = lVar15 + 0xc) {
          if ((puVar7[lVar15 + -2] == btyp) && (puVar7[lVar15 + -2] = cVar1, cVar1 == '\x15')) {
            puVar7[lVar15 + 1] = puVar7[lVar15 + 1] | 4;
          }
        }
        puVar7 = puVar7 + 0xfc;
      }
    }
  }
  free(new_locations);
  return;
}

Assistant:

void mkmap(struct level *lev, lev_init *init_lev)
{
	schar	bg_typ = init_lev->bg,
		fg_typ = init_lev->fg;
	boolean smooth = init_lev->smoothed,
		join = init_lev->joined;
	xchar   lit = init_lev->lit,
		walled = init_lev->walled;
	int i;

	if (lit < 0)
	    lit = (rnd(1+abs(depth(&u.uz))) < 11 && rn2(77)) ? 1 : 0;

	new_locations = malloc((WIDTH+1) * HEIGHT);

	if (bg_typ < MAX_TYPE)
	    init_map(lev, bg_typ);
	init_fill(lev, bg_typ, fg_typ);

	for (i = 0; i < N_P1_ITER; i++)
	    pass_one(lev, bg_typ, fg_typ);

	for (i = 0; i < N_P2_ITER; i++)
	    pass_two(lev, bg_typ, fg_typ);

	if (smooth)
	    for (i = 0; i < N_P3_ITER; i++)
		pass_three(lev, bg_typ, fg_typ);

	if (join)
	    join_map(lev, bg_typ, fg_typ);

	finish_map(lev, fg_typ, bg_typ, (boolean)lit, (boolean)walled);
	/* a walled, joined level is cavernous, not mazelike -dlc
	 *
	 * also, caverns have a defined "inside" and "outside"; the outside
	 * doesn't _have_ to be stone, say, for hell.  so if the player
	 * defined a maze filler originally, go ahead and backfill the
	 * background in with that filler - DSR */
	if (walled && join && init_lev->filling > -1) {
	    lev->flags.is_maze_lev = FALSE;
	    lev->flags.is_cavernous_lev = TRUE;
	    backfill(lev, bg_typ, init_lev->filling);
	}
	free(new_locations);
}